

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  uint uVar1;
  int iVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImFontGlyph *pIVar11;
  ImFontGlyph *pIVar12;
  uint uVar13;
  char *__function;
  float *pfVar14;
  int n;
  long lVar15;
  ulong uVar16;
  ushort uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  ImWchar dots_chars [2];
  ImWchar ellipsis_chars [2];
  ushort local_30 [4];
  
  uVar19 = (this->Glyphs).Size;
  if ((ulong)uVar19 == 0) {
    uVar21 = 1;
  }
  else {
    uVar21 = 0;
    uVar20 = 0;
    if (0 < (int)uVar19) {
      uVar20 = uVar19;
    }
    if (uVar20 <= uVar19 - 1) {
      __function = "T &ImVector<ImFontGlyph>::operator[](int) [T = ImFontGlyph]";
      goto LAB_0016f298;
    }
    lVar15 = 0;
    do {
      uVar20 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar15) >> 2;
      if (uVar20 < uVar21) {
        uVar20 = uVar21;
      }
      uVar21 = uVar20;
      lVar15 = lVar15 + 0x28;
    } while ((ulong)uVar19 * 0x28 != lVar15);
    if (0xfffe < (int)uVar19) {
      __assert_fail("Glyphs.Size < 0xFFFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_draw.cpp"
                    ,0xc56,"void ImFont::BuildLookupTable()");
    }
    uVar21 = uVar21 + 1;
  }
  pfVar3 = (this->IndexAdvanceX).Data;
  if (pfVar3 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar3);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar4 = (this->IndexLookup).Data;
  if (puVar4 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar4);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar21);
  uVar19 = (this->Glyphs).Size;
  uVar18 = (ulong)uVar19;
  if ((int)uVar19 < 1) {
    uVar20 = (this->IndexLookup).Size;
  }
  else {
    pfVar3 = (this->IndexAdvanceX).Data;
    puVar4 = (this->IndexLookup).Data;
    pfVar14 = &((this->Glyphs).Data)->AdvanceX;
    uVar16 = 0;
    do {
      uVar1 = *(uint *)(pfVar14 + -1);
      uVar13 = uVar1 >> 2;
      if ((this->IndexAdvanceX).Size <= (int)uVar13) goto LAB_0016f26c;
      pfVar3[uVar13] = *pfVar14;
      uVar20 = (this->IndexLookup).Size;
      if ((int)uVar20 <= (int)uVar13) goto LAB_0016f283;
      puVar4[uVar13] = (unsigned_short)uVar16;
      this->Used4kPagesMap[uVar1 >> 0x11] =
           this->Used4kPagesMap[uVar1 >> 0x11] | (byte)(1 << ((byte)(uVar1 >> 0xe) & 7));
      uVar16 = uVar16 + 1;
      pfVar14 = pfVar14 + 10;
    } while (uVar18 != uVar16);
  }
  if ((uVar20 < 0x21) || (uVar17 = (this->IndexLookup).Data[0x20], uVar17 == 0xffff)) {
    pIVar11 = this->FallbackGlyph;
  }
  else {
    pIVar11 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar17 * 0x28);
  }
  if (pIVar11 == (ImFontGlyph *)0x0) {
LAB_0016f05f:
    if ((uVar20 < 0x21) || (uVar17 = (this->IndexLookup).Data[0x20], uVar17 == 0xffff)) {
      pIVar11 = this->FallbackGlyph;
    }
    else {
      pIVar11 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar17 * 0x28);
    }
    if (pIVar11 != (ImFontGlyph *)0x0) {
      *(byte *)pIVar11 = *(byte *)pIVar11 & 0xfd;
      uVar20 = (this->IndexLookup).Size;
    }
    if ((uVar20 < 10) || (uVar17 = (this->IndexLookup).Data[9], uVar17 == 0xffff)) {
      pIVar11 = this->FallbackGlyph;
    }
    else {
      pIVar11 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar17 * 0x28);
    }
    if (pIVar11 != (ImFontGlyph *)0x0) {
      *(byte *)pIVar11 = *(byte *)pIVar11 & 0xfd;
      uVar20 = (this->IndexLookup).Size;
    }
    local_30[2] = 0x2026;
    local_30[3] = 0x85;
    local_30[0] = 0x2e;
    local_30[1] = 0xff0e;
    puVar4 = (this->IndexLookup).Data;
    uVar18 = (ulong)(int)uVar20;
    if (this->EllipsisChar == 0xffff) {
      lVar15 = 0;
      do {
        uVar17 = local_30[lVar15 + 2];
        if (((uVar17 < uVar18) && (puVar4[uVar17] != 0xffff)) &&
           ((this->Glyphs).Data != (ImFontGlyph *)0x0)) goto LAB_0016f10e;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 2);
      uVar17 = 0xffff;
LAB_0016f10e:
      this->EllipsisChar = uVar17;
    }
    if (this->DotChar == 0xffff) {
      lVar15 = 0;
      do {
        uVar17 = local_30[lVar15];
        if (((uVar17 < uVar18) && (puVar4[uVar17] != 0xffff)) &&
           ((this->Glyphs).Data != (ImFontGlyph *)0x0)) goto LAB_0016f147;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 2);
      uVar17 = 0xffff;
LAB_0016f147:
      this->DotChar = uVar17;
    }
    if ((this->FallbackChar < uVar18) && ((ulong)puVar4[this->FallbackChar] != 0xffff)) {
      pIVar11 = (this->Glyphs).Data;
      pIVar12 = pIVar11 + puVar4[this->FallbackChar];
      this->FallbackGlyph = pIVar12;
      if (pIVar11 == (ImFontGlyph *)0x0) {
        pIVar11 = (ImFontGlyph *)0x0;
        goto LAB_0016f192;
      }
    }
    else {
      this->FallbackGlyph = (ImFontGlyph *)0x0;
      pIVar11 = (this->Glyphs).Data;
LAB_0016f192:
      lVar15 = 0;
      do {
        uVar17 = *(ushort *)((long)&DAT_001bfdf2 + lVar15);
        if ((uVar17 < uVar18) && (puVar4[uVar17] != 0xffff && pIVar11 != (ImFontGlyph *)0x0))
        goto LAB_0016f1d2;
        lVar15 = lVar15 + 2;
      } while (lVar15 != 6);
      uVar17 = 0xffff;
LAB_0016f1d2:
      this->FallbackChar = uVar17;
      if ((uVar17 < uVar18) && ((ulong)puVar4[uVar17] != 0xffff)) {
        pIVar12 = pIVar11 + puVar4[uVar17];
        this->FallbackGlyph = pIVar12;
        if (pIVar11 != (ImFontGlyph *)0x0) goto LAB_0016f22d;
        pIVar11 = (ImFontGlyph *)0x0;
      }
      else {
        this->FallbackGlyph = (ImFontGlyph *)0x0;
      }
      lVar15 = (long)(this->Glyphs).Size;
      if (lVar15 < 1) {
LAB_0016f2a2:
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                      ,0x70c,"T &ImVector<ImFontGlyph>::back() [T = ImFontGlyph]");
      }
      pIVar12 = pIVar11 + lVar15 + -1;
      this->FallbackGlyph = pIVar12;
      this->FallbackChar = (ImWchar)(*(uint *)pIVar12 >> 2);
    }
LAB_0016f22d:
    fVar22 = pIVar12->AdvanceX;
    this->FallbackAdvanceX = fVar22;
    pfVar3 = (this->IndexAdvanceX).Data;
    uVar18 = 0;
    while ((long)uVar18 < (long)(this->IndexAdvanceX).Size) {
      pfVar14 = pfVar3 + uVar18;
      if (*pfVar14 <= 0.0 && *pfVar14 != 0.0) {
        pfVar3[uVar18] = fVar22;
      }
      uVar18 = uVar18 + 1;
      if (uVar21 == uVar18) {
        return;
      }
    }
  }
  else {
    if ((int)uVar19 < 1) goto LAB_0016f2a2;
    pIVar11 = (this->Glyphs).Data;
    if (((undefined1  [40])pIVar11[uVar18 - 1] & (undefined1  [40])0xfffffffc) !=
        (undefined1  [40])0x24) {
      uVar18 = uVar18 + 1;
      iVar2 = (this->Glyphs).Capacity;
      if (iVar2 <= (int)uVar19) {
        if (iVar2 == 0) {
          uVar19 = 8;
        }
        else {
          uVar19 = iVar2 / 2 + iVar2;
        }
        uVar16 = (ulong)uVar19;
        if ((int)uVar19 <= (int)uVar18) {
          uVar16 = uVar18 & 0xffffffff;
        }
        pIVar11 = (ImFontGlyph *)ImGui::MemAlloc(uVar16 * 0x28);
        pIVar12 = (this->Glyphs).Data;
        if (pIVar12 != (ImFontGlyph *)0x0) {
          memcpy(pIVar11,pIVar12,(long)(this->Glyphs).Size * 0x28);
          ImGui::MemFree((this->Glyphs).Data);
        }
        (this->Glyphs).Data = pIVar11;
        (this->Glyphs).Capacity = (int)uVar16;
        uVar20 = (this->IndexLookup).Size;
      }
      (this->Glyphs).Size = (int)uVar18;
    }
    if ((uVar20 < 0x21) || (uVar16 = (ulong)(this->IndexLookup).Data[0x20], uVar16 == 0xffff)) {
      pIVar12 = this->FallbackGlyph;
    }
    else {
      pIVar12 = pIVar11 + uVar16;
    }
    fVar22 = pIVar12->V1;
    pIVar11[uVar18 - 1].U1 = pIVar12->U1;
    pIVar11[uVar18 - 1].V1 = fVar22;
    uVar7 = *(undefined4 *)&pIVar12->field_0x0;
    fVar8 = pIVar12->AdvanceX;
    fVar9 = pIVar12->X0;
    fVar10 = pIVar12->Y0;
    fVar22 = pIVar12->Y1;
    fVar5 = pIVar12->U0;
    fVar6 = pIVar12->V0;
    pIVar11[uVar18 - 1].X1 = pIVar12->X1;
    pIVar11[uVar18 - 1].Y1 = fVar22;
    pIVar11[uVar18 - 1].U0 = fVar5;
    pIVar11[uVar18 - 1].V0 = fVar6;
    *(undefined4 *)&pIVar11[uVar18 - 1].field_0x0 = uVar7;
    pIVar11[uVar18 - 1].AdvanceX = fVar8;
    pIVar11[uVar18 - 1].X0 = fVar9;
    pIVar11[uVar18 - 1].Y0 = fVar10;
    *(uint *)(pIVar11 + (uVar18 - 1)) = *(uint *)(pIVar11 + (uVar18 - 1)) & 3 | 0x24;
    fVar22 = pIVar11[uVar18 - 1].AdvanceX * 4.0;
    pIVar11[uVar18 - 1].AdvanceX = fVar22;
    if (9 < (this->IndexAdvanceX).Size) {
      (this->IndexAdvanceX).Data[9] = fVar22;
      uVar20 = (this->IndexLookup).Size;
      if ((int)uVar20 <= (int)(*(uint *)(pIVar11 + (uVar18 - 1)) >> 2)) {
LAB_0016f283:
        __function = "T &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
        goto LAB_0016f298;
      }
      (this->IndexLookup).Data[*(uint *)(pIVar11 + (uVar18 - 1)) >> 2] =
           (short)(this->Glyphs).Size - 1;
      goto LAB_0016f05f;
    }
  }
LAB_0016f26c:
  __function = "T &ImVector<float>::operator[](int) [T = float]";
LAB_0016f298:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                ,0x703,__function);
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Note that 0x2026 is rarely included in our font ranges. Because of this we are more likely to use three individual dots.
    const ImWchar ellipsis_chars[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
    const ImWchar dots_chars[] = { (ImWchar)'.', (ImWchar)0xFF0E };
    if (EllipsisChar == (ImWchar)-1)
        EllipsisChar = FindFirstExistingGlyph(this, ellipsis_chars, IM_ARRAYSIZE(ellipsis_chars));
    if (DotChar == (ImWchar)-1)
        DotChar = FindFirstExistingGlyph(this, dots_chars, IM_ARRAYSIZE(dots_chars));

    // Setup fallback character
    const ImWchar fallback_chars[] = { (ImWchar)IM_UNICODE_CODEPOINT_INVALID, (ImWchar)'?', (ImWchar)' ' };
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    if (FallbackGlyph == NULL)
    {
        FallbackChar = FindFirstExistingGlyph(this, fallback_chars, IM_ARRAYSIZE(fallback_chars));
        FallbackGlyph = FindGlyphNoFallback(FallbackChar);
        if (FallbackGlyph == NULL)
        {
            FallbackGlyph = &Glyphs.back();
            FallbackChar = (ImWchar)FallbackGlyph->Codepoint;
        }
    }

    FallbackAdvanceX = FallbackGlyph->AdvanceX;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}